

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTableIterator::~MemTableIterator(MemTableIterator *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__MemTableIterator_01617bc0;
  std::__cxx11::string::~string(in_RDI);
  Iterator::~Iterator(&this->super_Iterator);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~MemTableIterator() override = default;